

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev-lang-demo.cpp
# Opt level: O3

void motor_action(servo_motor *m)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  _Alloc_hider _Var5;
  char c;
  int new_value;
  string new_mode;
  byte local_d5;
  int local_d4;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d5 = 0;
  local_d4 = 0;
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"*** servo motor (",0x11);
    ev3dev::servo_motor::address_abi_cxx11_(&local_50,m);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") actions ***",0xd);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(c)ommand",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(p)osition_sp  (",0x10);
    iVar2 = ev3dev::servo_motor::position_sp(m);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(r)ate_sp      (",0x10);
    iVar2 = ev3dev::servo_motor::rate_sp(m);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"mi(n) pulse sp (",0x10);
    iVar2 = ev3dev::servo_motor::min_pulse_sp(m);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"mi(d) pulse sp (",0x10);
    iVar2 = ev3dev::servo_motor::mid_pulse_sp(m);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ma(x) pulse sp (",0x10);
    iVar2 = ev3dev::servo_motor::max_pulse_sp(m);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"p(o)larity     [",0x10);
    ev3dev::servo_motor::polarity_abi_cxx11_(&local_70,m);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(b)ack",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Choice: ",8);
    std::operator>>((istream *)&std::cin,(char *)&local_d5);
    switch(local_d5) {
    case 0x6e:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"min pulse sp: ",0xe)
      ;
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      ev3dev::servo_motor::set_min_pulse_sp(m,local_d4);
      break;
    case 0x6f:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"polarity (normal, inverted): ",0x1d);
      std::operator>>((istream *)&std::cin,(string *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_d0,local_d0 + local_c8);
      ev3dev::servo_motor::set_polarity(m,&local_b0);
      psVar1 = &local_b0;
      _Var5._M_p = local_b0._M_dataplus._M_p;
LAB_0011173f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != &psVar1->field_2) {
        operator_delete(_Var5._M_p);
      }
      break;
    case 0x70:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"position sp: ",0xd);
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      ev3dev::servo_motor::set_position_sp(m,local_d4);
      break;
    case 0x71:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
      goto switchD_0011157d_caseD_71;
    case 0x72:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rate sp: ",9);
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      ev3dev::servo_motor::set_rate_sp(m,local_d4);
      break;
    case 0x78:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"max pulse sp: ",0xe)
      ;
      std::istream::operator>>((istream *)&std::cin,&local_d4);
      ev3dev::servo_motor::set_max_pulse_sp(m,local_d4);
      break;
    default:
      if (local_d5 == 99) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"command (run, float): ",0x16);
        std::operator>>((istream *)&std::cin,(string *)&local_d0);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_d0,local_d0 + local_c8);
        ev3dev::servo_motor::set_command(m,&local_90);
        psVar1 = &local_90;
        _Var5._M_p = local_90._M_dataplus._M_p;
        goto LAB_0011173f;
      }
      if (local_d5 == 100) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"mid pulse sp: ",0xe);
        std::istream::operator>>((istream *)&std::cin,&local_d4);
        ev3dev::servo_motor::set_mid_pulse_sp(m,local_d4);
        break;
      }
      goto switchD_0011157d_caseD_71;
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
switchD_0011157d_caseD_71:
    if (local_d5 == 0x62) {
      if (local_d0 != local_c0) {
        operator_delete(local_d0);
      }
      return;
    }
  } while( true );
}

Assistant:

void motor_action(servo_motor &m)
{
  char c = 0;
  int new_value = 0;
  std::string new_mode;

  do
  {
    cout << endl
         << "*** servo motor (" << m.address() << ") actions ***" << endl
         << endl
         << "(c)ommand" << endl
         << "(p)osition_sp  (" << m.position_sp()  << ")" << endl
         << "(r)ate_sp      (" << m.rate_sp()      << ")" << endl
         << "mi(n) pulse sp (" << m.min_pulse_sp() << ")" << endl
         << "mi(d) pulse sp (" << m.mid_pulse_sp() << ")" << endl
         << "ma(x) pulse sp (" << m.max_pulse_sp() << ")" << endl
         << "p(o)larity     [" << m.polarity()     << "]" << endl;
    cout << endl << "(b)ack" << endl
         << endl
         << "Choice: ";
    cin >> c;

    switch (c)
    {
    case 'c':
      cout << "command (run, float): ";
      cin >> new_mode; m.set_command(new_mode); cout << endl;
      break;
    case 'p':
      cout << "position sp: "; cin >> new_value; m.set_position_sp(new_value); cout << endl;
      break;
    case 'o':
      cout << "polarity (normal, inverted): ";
      cin >> new_mode; m.set_polarity(new_mode); cout << endl;
      break;
    case 'r':
      cout << "rate sp: "; cin >> new_value; m.set_rate_sp(new_value); cout << endl;
      break;
    case 'n':
      cout << "min pulse sp: "; cin >> new_value; m.set_min_pulse_sp(new_value); cout << endl;
      break;
    case 'd':
      cout << "mid pulse sp: "; cin >> new_value; m.set_mid_pulse_sp(new_value); cout << endl;
      break;
    case 'x':
      cout << "max pulse sp: "; cin >> new_value; m.set_max_pulse_sp(new_value); cout << endl;
      break;
    }
  }
  while (c != 'b');
}